

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

string * __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::asString_abi_cxx11_
          (string *__return_storage_ptr__,View<int,false,std::allocator<unsigned_long>> *this,
          StringStyle *style)

{
  size_type __n;
  char cVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_00;
  reference piVar2;
  ostream *poVar3;
  size_t sVar4;
  long *plVar5;
  runtime_error *prVar6;
  ulong uVar7;
  size_t x;
  ulong uVar8;
  char cVar9;
  size_t y;
  uint uVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c1;
  const_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c2;
  ostringstream out;
  char local_211;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8,_S_out);
  cVar1 = (char)(ostringstream *)local_1a8;
  if (*style == TableStyle) {
    if (*(long *)this == 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_0023288d:
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(size_type *)(this + 0x28) != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_210,*(size_type *)(this + 0x28),(allocator_type *)&local_1f8);
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
      do {
        if (CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) == 0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_002327ed:
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1f8.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        if (*(ulong *)(CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) + 0x30) <=
            local_1f8.index_) goto joined_r0x0023210f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A(",2);
        Iterator<int,true,std::allocator<unsigned_long>>::
        coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Iterator<int,true,std::allocator<unsigned_long>> *)&local_1f8,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        if (local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar7 = 0;
          do {
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1c8,1);
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)local_210.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_210.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\b) = ",5);
        if ((CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) == 0) ||
           (*(ulong *)(CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) + 0x30) <=
            local_1f8.index_)) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"Assertion failed.");
          goto LAB_002327ed;
        }
        plVar5 = (long *)std::ostream::operator<<((ostream *)local_1a8,*local_1f8.pointer_);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_1f8);
      } while( true );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A = ",4);
    local_1f8.view_._0_4_ = 0;
    piVar2 = marray_detail::AccessOperatorHelper<true>::
             execute<int,int,false,std::allocator<unsigned_long>>
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)this,(int *)&local_1f8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
LAB_002321f8:
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    if (*style != MatrixStyle) goto LAB_00232656;
    if (*(long *)this == 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
      goto LAB_0023288d;
    }
    __n = *(size_type *)(this + 0x28);
    if (__n != 2) {
      if (__n == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A = (",5);
        if (*(long *)(this + 0x30) != 0) {
          sVar4 = 0;
          do {
            piVar2 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                               ((View<int,_false,_std::allocator<unsigned_long>_> *)this,sVar4);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            sVar4 = sVar4 + 1;
          } while (sVar4 < *(ulong *)(this + 0x30));
        }
        poVar3 = (ostream *)local_1a8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\b\b)",3);
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)poVar3);
      }
      else {
        if (__n != 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_210,__n,(allocator_type *)&local_1f8);
          if (*(long *)this == 0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1c8,*(size_type *)(this + 0x28),(allocator_type *)&local_1f8);
          View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
          uVar10 = 2;
          if (*(int *)(this + 0x38) == 0) {
            sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
            uVar10 = (int)sVar4 + 0xfdU & 0xff;
          }
          View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
          Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
LAB_00232375:
          if (CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) == 0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
          }
          else {
            if (*(ulong *)(CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) + 0x30) <=
                local_1f8.index_) {
              if (local_1f8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
              std::ostream::put((char)local_1a8);
              std::ostream::flush();
              local_1f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(local_1c8.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_1c8.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_);
joined_r0x0023210f:
              if (local_1f8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1c8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                operator_delete(local_210.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_210.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_210.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_0023262b;
            }
            it_00._M_current._1_7_ =
                 local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start._1_7_;
            it_00._M_current._0_1_ =
                 local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start._0_1_;
            Iterator<int,true,std::allocator<unsigned_long>>::
            coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((Iterator<int,true,std::allocator<unsigned_long>> *)&local_1f8,it_00);
            if (local_1f8.index_ == 0) {
LAB_00232421:
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
              if (*(int *)(this + 0x38) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A(",2);
                if (*(long *)this == 0) {
LAB_00232781:
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                  __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                uVar7 = 0;
                while (uVar7 < *(long *)(this + 0x28) - 2U) {
                  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
                  uVar7 = uVar7 + 1;
                  if (*(long *)this == 0) goto LAB_00232781;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A(c,r,",6);
                if (*(long *)this == 0) {
LAB_0023274f:
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                  __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                uVar7 = 2;
                while (uVar7 < *(ulong *)(this + 0x28)) {
                  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
                  uVar7 = uVar7 + 1;
                  if (*(long *)this == 0) goto LAB_0023274f;
                }
              }
              local_211 = '\b';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_211,1);
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
              if (*(int *)(this + 0x38) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",r,c",4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") =",3);
LAB_00232536:
              std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
              std::ostream::put(cVar1);
              std::ostream::flush();
            }
            else {
              if (*(long *)(CONCAT71(local_1c8.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_1c8.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           (ulong)(uVar10 << 3)) !=
                  *(long *)((long)local_210.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (ulong)(uVar10 << 3)))
              {
                std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
                std::ostream::put(cVar1);
                plVar5 = (long *)std::ostream::flush();
                std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
                std::ostream::put((char)plVar5);
                std::ostream::flush();
                goto LAB_00232421;
              }
              if (*(unsigned_long *)
                   (CONCAT71(local_1c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_1c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_) + 8) !=
                  local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[1]) goto LAB_00232536;
            }
            if ((CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) != 0) &&
               (local_1f8.index_ <
                *(ulong *)(CONCAT44(local_1f8.view_._4_4_,local_1f8.view_._0_4_) + 0x30)))
            goto code_r0x0023257c;
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
          }
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A = ",4);
        local_1f8.view_._0_4_ = 0;
        piVar2 = marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)this,
                            (int *)&local_1f8);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
      goto LAB_002321f8;
    }
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (*(int *)(this + 0x38) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A(r,c) =",8);
      std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
      for (uVar7 = 0;
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0),
          uVar7 < sVar4; uVar7 = uVar7 + 1) {
        for (uVar8 = 0;
            sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)this,1),
            uVar8 < sVar4; uVar8 = uVar8 + 1) {
          piVar2 = operator()(this,uVar7,uVar8);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar2);
          local_1f8.view_._0_4_ = CONCAT31(local_1f8.view_._1_3_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
        }
        cVar9 = (char)(ostream *)local_1a8;
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"A(c,r) =",8);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
      cVar9 = (char)(ostream *)local_1a8;
      std::ostream::put(cVar9);
      std::ostream::flush();
      for (uVar7 = 0;
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,1),
          uVar7 < sVar4; uVar7 = uVar7 + 1) {
        for (uVar8 = 0;
            sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0),
            uVar8 < sVar4; uVar8 = uVar8 + 1) {
          piVar2 = operator()(this,uVar8,uVar7);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar2);
          local_1f8.view_._0_4_ = CONCAT31(local_1f8.view_._1_3_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
        }
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
      }
    }
  }
LAB_0023262b:
  std::ios::widen(cVar1 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
LAB_00232656:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
code_r0x0023257c:
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*local_1f8.pointer_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&local_210,&local_1c8);
  Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_1f8);
  goto LAB_00232375;
}

Assistant:

std::string 
View<T, isConst, A>::asString
(
    const StringStyle& style
) const
{
    testInvariant();
    std::ostringstream out(std::ostringstream::out);
    if(style == MatrixStyle) {
        if(dimension() == 0) {
            // scalar
            out << "A = " << (*this)(0) << std::endl;
        }
        else if(dimension() == 1) {
            // vector
            out << "A = (";
            for(std::size_t j=0; j<this->size(); ++j) {
                out << (*this)(j) << ", ";
            }
            out << "\b\b)" << std::endl;
        }
        else if(dimension() == 2) {
            // matrix
            if(coordinateOrder() == FirstMajorOrder) {
                out << "A(r,c) =" << std::endl;
                for(std::size_t y=0; y<this->shape(0); ++y) {
                    for(std::size_t x=0; x<this->shape(1); ++x) {
                        out << (*this)(y, x) << ' ';
                    }
                    out << std::endl;
                }
            }
            else {
                out << "A(c,r) =" << std::endl;
                for(std::size_t y=0; y<this->shape(1); ++y) {
                    for(std::size_t x=0; x<this->shape(0); ++x) {
                        out << (*this)(x, y) << ' ';
                    }
                    out << std::endl;
                }
            }
        }
        else {
            // higher dimensional
            std::vector<std::size_t> c1(dimension());
            std::vector<std::size_t> c2(dimension());
            unsigned short q = 2;
            if(coordinateOrder() == FirstMajorOrder) {
                q = static_cast<unsigned char>(dimension() - 3);
            }
            for(const_iterator it = this->begin(); it.hasMore(); ++it) {
                it.coordinate(c2.begin());
                if(it.index() == 0 || c2[q] != c1[q]) {
                    if(it.index() != 0) {
                        out << std::endl << std::endl;
                    }
                    if(coordinateOrder() == FirstMajorOrder) {
                        out << "A(";
                        for(std::size_t j=0; j<dimension()-2; ++j) {
                            out << c2[j] << ",";
                        }
                    }
                    else {
                        out << "A(c,r,";
                        for(std::size_t j=2; j<dimension(); ++j) {
                            out << c2[j] << ",";
                        }
                    }
                    out << '\b';
                    if(coordinateOrder() == FirstMajorOrder) {
                        out << ",r,c";
                    }
                    out << ") =" << std::endl;
                }
                else if(c2[1] != c1[1]) {
                    out << std::endl;
                }
                out << *it << " ";
                c1 = c2;
            }
            out << std::endl;
        }
        out << std::endl;
    }
    else if(style == TableStyle) {
        if(dimension() == 0) {
            // scalar
            out << "A = " << (*this)(0) << std::endl;
        }
        else {
            // non-scalar
            std::vector<std::size_t> c(dimension());
            for(const_iterator it = this->begin(); it.hasMore(); ++it) {
                out << "A(";
                it.coordinate(c.begin());
                for(std::size_t j=0; j<c.size(); ++j) {
                    out << c[j] << ',';
                }
                out << "\b) = " << *it << std::endl;
            }
        }
        out << std::endl;
    }
    return out.str();
}